

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

_Bool ggml_backend_sched_reserve(ggml_backend_sched_t sched,ggml_cgraph *measure_graph)

{
  _func_void_ggml_backend_t *p_Var1;
  _Bool _Var2;
  long lVar3;
  
  if (measure_graph->n_leafs + measure_graph->n_nodes <= (int)(sched->hash_set).size) {
    ggml_backend_sched_split_graph(sched,measure_graph);
    if (0 < sched->n_backends) {
      lVar3 = 0;
      do {
        p_Var1 = (sched->backends[lVar3]->iface).synchronize;
        if (p_Var1 != (_func_void_ggml_backend_t *)0x0) {
          (*p_Var1)(sched->backends[lVar3]);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < sched->n_backends);
    }
    _Var2 = ggml_gallocr_reserve_n
                      (sched->galloc,&sched->graph,sched->node_backend_ids,sched->leaf_backend_ids);
    if (_Var2) {
      ggml_backend_sched_reset(sched);
    }
    return _Var2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x607,"GGML_ASSERT(%s) failed",
             "(int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs");
}

Assistant:

bool ggml_backend_sched_reserve(ggml_backend_sched_t sched, struct ggml_cgraph * measure_graph) {
    GGML_ASSERT((int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs);

    ggml_backend_sched_split_graph(sched, measure_graph);

    ggml_backend_sched_synchronize(sched);

    if (!ggml_gallocr_reserve_n(sched->galloc, &sched->graph, sched->node_backend_ids, sched->leaf_backend_ids)) {
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}